

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::MemoryOutputStream
          (MemoryOutputStream *this,GeneratorContextImpl *directory,string *filename,
          string *insertion_point)

{
  StringOutputStream *this_00;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__MemoryOutputStream_00424c08;
  this->directory_ = directory;
  std::__cxx11::string::string((string *)&this->filename_,(string *)filename);
  std::__cxx11::string::string((string *)&this->insertion_point_,(string *)insertion_point);
  (this->data_)._M_dataplus._M_p = (pointer)&(this->data_).field_2;
  (this->data_)._M_string_length = 0;
  (this->data_).field_2._M_local_buf[0] = '\0';
  this_00 = (StringOutputStream *)operator_new(0x10);
  io::StringOutputStream::StringOutputStream(this_00,&this->data_);
  (this->inner_).ptr_ = this_00;
  return;
}

Assistant:

CommandLineInterface::MemoryOutputStream::MemoryOutputStream(
    GeneratorContextImpl* directory, const string& filename,
    const string& insertion_point)
    : directory_(directory),
      filename_(filename),
      insertion_point_(insertion_point),
      inner_(new io::StringOutputStream(&data_)) {
}